

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall FExecList::AddPullins(FExecList *this,TArray<FString,_FString> *wads)

{
  ulong uVar1;
  
  if ((this->Pullins).Count != 0) {
    uVar1 = 0;
    do {
      D_AddFile(wads,(this->Pullins).Array[uVar1].Chars,true,-1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->Pullins).Count);
  }
  return;
}

Assistant:

void FExecList::AddPullins(TArray<FString> &wads) const
{
	for (unsigned i = 0; i < Pullins.Size(); ++i)
	{
		D_AddFile(wads, Pullins[i]);
	}
}